

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O3

bool __thiscall
axl::sl::Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
reserve(Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_> *this,
       size_t count)

{
  int32_t *piVar1;
  FreeFunc *pFVar2;
  Hdr *pHVar3;
  size_t sVar4;
  EVP_PKEY_CTX *dst;
  Ret *pRVar5;
  Hdr *pHVar6;
  Hdr *pHVar7;
  bool bVar8;
  Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> hdr;
  Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> local_38;
  
  pHVar7 = (this->
           super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
           ).m_hdr;
  if (((pHVar7 == (Hdr *)0x0) || ((pHVar7->super_BufHdr).super_RefCount.m_refCount != 1)) ||
     (bVar8 = true, (pHVar7->super_BufHdr).m_bufferSize < count << 4)) {
    sVar4 = getAllocSize<4096ul>(count << 4);
    dst = (EVP_PKEY_CTX *)operator_new(sVar4 + 0x30,(nothrow_t *)&std::nothrow);
    *(undefined4 *)(dst + 0x10) = 0;
    *(undefined4 *)(dst + 0x14) = 1;
    *(size_t *)(dst + 0x18) = sVar4;
    *(undefined8 *)(dst + 0x20) = 0;
    *(undefined ***)dst = &PTR__Hdr_0019e078;
    *(code **)(dst + 8) = mem::deallocate;
    local_38.m_p = (Hdr *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::copy(&local_38,dst,dst);
    bVar8 = local_38.m_p != (Hdr *)0x0;
    if (bVar8) {
      sVar4 = (this->
              super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
              ).m_count;
      (local_38.m_p)->m_count = sVar4;
      pHVar7 = local_38.m_p + 1;
      if ((sVar4 != 0) && (0 < (long)sVar4)) {
        pRVar5 = (this->
                 super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                 ).m_p;
        pHVar6 = pHVar7;
        do {
          pFVar2 = (FreeFunc *)pRVar5->m_originalRet;
          (pHVar6->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)pRVar5->m_context;
          (pHVar6->super_BufHdr).super_RefCount.m_freeFunc = pFVar2;
          pHVar6 = (Hdr *)&(pHVar6->super_BufHdr).super_RefCount.m_refCount;
          pRVar5 = pRVar5 + 1;
        } while (pHVar6 < &(pHVar7->super_BufHdr).super_RefCount._vptr_RefCount + sVar4 * 2);
      }
      pHVar6 = (this->
               super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
               ).m_hdr;
      if (pHVar6 != (Hdr *)0x0) {
        LOCK();
        piVar1 = &(pHVar6->super_BufHdr).super_RefCount.m_refCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(pHVar6->super_BufHdr).super_RefCount._vptr_RefCount)(pHVar6);
          LOCK();
          piVar1 = &(pHVar6->super_BufHdr).super_RefCount.m_weakRefCount;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) &&
             (pFVar2 = (pHVar6->super_BufHdr).super_RefCount.m_freeFunc, pFVar2 != (FreeFunc *)0x0))
          {
            (*pFVar2)(pHVar6);
          }
        }
      }
      pHVar3 = local_38.m_p;
      (this->
      super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
      ).m_p = (Ret *)pHVar7;
      local_38.m_p = (Hdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      (this->
      super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
      ).m_hdr = pHVar3;
    }
    rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::clear(&local_38);
  }
  return bVar8;
}

Assistant:

bool
	reserve(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1 &&
			this->m_hdr->m_bufferSize >= size)
			return true;

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, this->m_count);

		T* p = (T*)(hdr + 1);

		if (this->m_count)
			Details::constructCopy(p, this->m_p, this->m_count);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		return true;
	}